

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O3

void __thiscall test_app::test_gzip(test_app *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  string *psVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  ostringstream oss;
  string local_1d0;
  string local_1b0 [12];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Page Gzip",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  set_context(this,true);
  cppcms::application::cache();
  cppcms::cache_interface::clear();
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)local_1b0);
  iVar4 = std::__cxx11::string::compare((char *)local_1b0);
  paVar1 = &local_1b0[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x78);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," request().getenv(\"HTTP_ACCEPT_ENCODING\") == \"gzip, deflate\"",0x3c);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::application::request();
  paVar2 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"HTTP_ACCEPT_ENCODING","");
  cppcms::http::request::getenv((string *)local_1b0);
  iVar4 = std::__cxx11::string::compare((char *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x79);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " request().getenv(std::string(\"HTTP_ACCEPT_ENCODING\")) == \"gzip, deflate\"",0x49)
    ;
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar6 = (string *)cppcms::application::cache();
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
  cppcms::cache_interface::fetch_page(psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  cppcms::application::response();
  poVar7 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"gzip",4);
  psVar6 = (string *)cppcms::application::cache();
  local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
  cppcms::cache_interface::store_page(psVar6,(int)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  str_abi_cxx11_(&local_1d0,this);
  std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_1d0);
  iVar4 = std::__cxx11::string::compare((char *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," str().substr(0,2)==\"\\x1f\\x8b\"",0x1e);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->gzip_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," gzip_",6);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  set_context(this,false);
  cppcms::application::request();
  cppcms::http::request::getenv_abi_cxx11_((char *)local_1b0);
  iVar4 = std::__cxx11::string::compare((char *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  if (iVar4 == 0) {
    uVar5 = cache_size(this);
    if (uVar5 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x83);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," cache_size() == 1",0x12);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar6 = (string *)cppcms::application::cache();
    local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
    cVar3 = cppcms::cache_interface::fetch_page(psVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    if (cVar3 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x85);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," cache().fetch_page(\"test\") ==false",0x23);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::application::response();
    poVar7 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"gzip",4);
    psVar6 = (string *)cppcms::application::cache();
    local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
    cppcms::cache_interface::store_page(psVar6,(int)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    str_abi_cxx11_(local_1b0,this);
    iVar4 = std::__cxx11::string::compare((char *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," str() == \"gzip\"",0x10);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->gzip_ == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x89);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," !gzip_",7);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    set_context(this,false);
    psVar6 = (string *)cppcms::application::cache();
    local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
    cVar3 = cppcms::cache_interface::fetch_page(psVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    if (cVar3 != '\0') {
      str_abi_cxx11_(local_1b0,this);
      iVar4 = std::__cxx11::string::compare((char *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0[0]._M_dataplus._M_p);
      }
      if (iVar4 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                   ,0x66);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x8d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," str()==\"gzip\"",0xe);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (this->gzip_ == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                   ,0x66);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x8e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," !gzip_",7);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      set_context(this,true);
      psVar6 = (string *)cppcms::application::cache();
      local_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"test","");
      cVar3 = cppcms::cache_interface::fetch_page(psVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0[0]._M_dataplus._M_p);
      }
      if (cVar3 != '\0') {
        str_abi_cxx11_(&local_1d0,this);
        std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_1d0);
        iVar4 = std::__cxx11::string::compare((char *)local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b0[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if (iVar4 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x92);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," str().substr(0,2)==\"\\x1f\\x8b\"",0x1e);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (this->gzip_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x93);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," gzip_",6);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        set_context(this,false);
        uVar5 = cache_size(this);
        if (uVar5 == 2) {
          cppcms::application::cache();
          cppcms::cache_interface::clear();
          uVar5 = cache_size(this);
          if (uVar5 == 0) {
            cppcms::application::release_context();
            if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
            }
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x98);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," cache_size()==0",0x10);
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                   ,0x66);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x96);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," cache_size()==2",0x10);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x91);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," cache().fetch_page(\"test\")",0x1b);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x8c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," cache().fetch_page(\"test\")",0x1b);
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1b0,0x82);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," request().getenv(\"HTTP_ACCEPT_ENCODING\") == \"\"",0x2f);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar8,(string *)&local_1d0);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_gzip()
	{
		std::cout << "- Page Gzip" << std::endl;
		set_context(true);
		cache().clear();
		TEST(request().getenv("HTTP_ACCEPT_ENCODING") == "gzip, deflate");
		TEST(request().getenv(std::string("HTTP_ACCEPT_ENCODING")) == "gzip, deflate");
		cache().fetch_page("test");
		response().out() << "gzip";
		cache().store_page("test");
		TEST(str().substr(0,2)=="\x1f\x8b");
		TEST(gzip_);
		
		set_context(false);
	
		TEST(request().getenv("HTTP_ACCEPT_ENCODING") == "");
		TEST(cache_size() == 1);

		TEST(cache().fetch_page("test") ==false);
		response().out() << "gzip";
		cache().store_page("test");
		TEST(str() == "gzip");
		TEST(!gzip_);

		set_context(false);
		TEST(cache().fetch_page("test"));
		TEST(str()=="gzip");
		TEST(!gzip_);

		set_context(true);
		TEST(cache().fetch_page("test"));
		TEST(str().substr(0,2)=="\x1f\x8b");
		TEST(gzip_);

		set_context(false);
		TEST(cache_size()==2);
		cache().clear();
		TEST(cache_size()==0);
		release_context();
	}